

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O0

int db_setlocal(lua_State *L)

{
  int iVar1;
  lua_Integer lVar2;
  lua_Integer lVar3;
  char *s;
  int nvar;
  int level;
  lua_Debug ar;
  lua_State *L1;
  char *name;
  lua_State *plStack_18;
  int arg;
  lua_State *L_local;
  
  plStack_18 = L;
  ar.i_ci = (CallInfo *)getthread(L,(int *)((long)&name + 4));
  lVar2 = luaL_checkinteger(plStack_18,name._4_4_ + 1);
  lVar3 = luaL_checkinteger(plStack_18,name._4_4_ + 2);
  iVar1 = lua_getstack((lua_State *)ar.i_ci,(int)lVar2,(lua_Debug *)&nvar);
  if (iVar1 == 0) {
    L_local._4_4_ = luaL_argerror(plStack_18,name._4_4_ + 1,"level out of range");
  }
  else {
    luaL_checkany(plStack_18,name._4_4_ + 3);
    lua_settop(plStack_18,name._4_4_ + 3);
    checkstack(plStack_18,(lua_State *)ar.i_ci,1);
    lua_xmove(plStack_18,(lua_State *)ar.i_ci,1);
    s = lua_setlocal((lua_State *)ar.i_ci,(lua_Debug *)&nvar,(int)lVar3);
    if (s == (char *)0x0) {
      lua_settop((lua_State *)ar.i_ci,-2);
    }
    lua_pushstring(plStack_18,s);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int db_setlocal (lua_State *L) {
  int arg;
  const char *name;
  lua_State *L1 = getthread(L, &arg);
  lua_Debug ar;
  int level = (int)luaL_checkinteger(L, arg + 1);
  int nvar = (int)luaL_checkinteger(L, arg + 2);
  if (l_unlikely(!lua_getstack(L1, level, &ar)))  /* out of range? */
    return luaL_argerror(L, arg+1, "level out of range");
  luaL_checkany(L, arg+3);
  lua_settop(L, arg+3);
  checkstack(L, L1, 1);
  lua_xmove(L, L1, 1);
  name = lua_setlocal(L1, &ar, nvar);
  if (name == NULL)
    lua_pop(L1, 1);  /* pop value (if not popped by 'lua_setlocal') */
  lua_pushstring(L, name);
  return 1;
}